

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O0

lysp_feature * lysp_feature_find(lysp_module *pmod,char *name,size_t len,ly_bool prefixed)

{
  int iVar1;
  uint32_t local_4c;
  lysp_feature *plStack_48;
  uint32_t idx;
  lysp_feature *f;
  char *ptr;
  lys_module *mod;
  size_t sStack_28;
  ly_bool prefixed_local;
  size_t len_local;
  char *name_local;
  lysp_module *pmod_local;
  
  plStack_48 = (lysp_feature *)0x0;
  local_4c = 0;
  mod._7_1_ = prefixed;
  sStack_28 = len;
  len_local = (size_t)name;
  name_local = (char *)pmod;
  if (pmod == (lysp_module *)0x0) {
    __assert_fail("pmod",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_features.c"
                  ,0xbd,
                  "struct lysp_feature *lysp_feature_find(const struct lysp_module *, const char *, size_t, ly_bool)"
                 );
  }
  if ((prefixed != '\0') &&
     (f = (lysp_feature *)ly_strnchr(name,0x3a,len), f != (lysp_feature *)0x0)) {
    ptr = (char *)ly_resolve_prefix((ly_ctx *)**(undefined8 **)name_local,(void *)len_local,
                                    (long)f - len_local,LY_VALUE_SCHEMA,name_local);
    if ((lys_module *)ptr == (lys_module *)0x0) {
      return (lysp_feature *)0x0;
    }
    name_local = (char *)((lys_module *)ptr)->parsed;
    sStack_28 = (sStack_28 - ((long)f - len_local)) - 1;
    len_local = (long)&f->name + 1;
  }
  if (((byte)name_local[0x79] >> 1 & 1) != 0) {
    name_local = *(char **)(*(long *)name_local + 0x50);
  }
  do {
    plStack_48 = lysp_feature_next(plStack_48,(lysp_module *)name_local,&local_4c);
    if (plStack_48 == (lysp_feature *)0x0) {
      return (lysp_feature *)0x0;
    }
    iVar1 = ly_strncmp(plStack_48->name,(char *)len_local,sStack_28);
  } while (iVar1 != 0);
  return plStack_48;
}

Assistant:

static struct lysp_feature *
lysp_feature_find(const struct lysp_module *pmod, const char *name, size_t len, ly_bool prefixed)
{
    const struct lys_module *mod;
    const char *ptr;
    struct lysp_feature *f = NULL;
    uint32_t idx = 0;

    assert(pmod);

    if (prefixed && (ptr = ly_strnchr(name, ':', len))) {
        /* we have a prefixed feature */
        mod = ly_resolve_prefix(pmod->mod->ctx, name, ptr - name, LY_VALUE_SCHEMA, (void *)pmod);
        LY_CHECK_RET(!mod, NULL);

        pmod = mod->parsed;
        len = len - (ptr - name) - 1;
        name = ptr + 1;
    }

    /* feature without prefix, look in main module and all submodules */
    if (pmod->is_submod) {
        pmod = pmod->mod->parsed;
    }

    /* we have the correct module, get the feature */
    while ((f = lysp_feature_next(f, pmod, &idx))) {
        if (!ly_strncmp(f->name, name, len)) {
            return f;
        }
    }

    return NULL;
}